

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

void __thiscall
pybind11::capsule::capsule(capsule *this,void *value,_func_void_void_ptr *destructor)

{
  int iVar1;
  PyObject *pPVar2;
  error_already_set *this_00;
  
  (this->super_object).super_handle.m_ptr = (PyObject *)0x0;
  pPVar2 = (PyObject *)PyCapsule_New(value,0,capsule::anon_class_1_0_00000001::__invoke);
  (this->super_object).super_handle.m_ptr = pPVar2;
  if (pPVar2 != (PyObject *)0x0) {
    iVar1 = PyCapsule_SetContext(pPVar2,destructor);
    if (iVar1 == 0) {
      return;
    }
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

capsule(const void *value, void (*destructor)(void *)) {
        m_ptr = PyCapsule_New(const_cast<void *>(value), nullptr, [](PyObject *o) {
            // guard if destructor called while err indicator is set
            error_scope error_guard;
            auto destructor = reinterpret_cast<void (*)(void *)>(PyCapsule_GetContext(o));
            if (destructor == nullptr && PyErr_Occurred()) {
                throw error_already_set();
            }
            const char *name = get_name_in_error_scope(o);
            void *ptr = PyCapsule_GetPointer(o, name);
            if (ptr == nullptr) {
                throw error_already_set();
            }

            if (destructor != nullptr) {
                destructor(ptr);
            }
        });

        if (!m_ptr || PyCapsule_SetContext(m_ptr, reinterpret_cast<void *>(destructor)) != 0) {
            throw error_already_set();
        }
    }